

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall
pbrt::TriangleMesh::TriangleMesh
          (TriangleMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *s,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv,
          vector<int,_std::allocator<int>_> faceIndices)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  pointer pPVar6;
  long lVar7;
  undefined8 *puVar8;
  pointer pVVar9;
  float fVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  Point3f *pt;
  int *piVar14;
  pointer pPVar15;
  Point3<float> *pPVar16;
  Point2<float> *pPVar17;
  undefined8 *puVar18;
  Normal3<float> *pNVar19;
  pointer pVVar20;
  Vector3<float> *pVVar21;
  ulong uVar22;
  char *args_1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int vb;
  size_type va;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *local_38;
  
  uVar22 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  iVar13 = (int)(uVar22 / 3);
  this->nTriangles = iVar13;
  va = uVar22 % 3;
  this->nVertices =
       (int)((ulong)((long)(p->
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(p->
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  this->vertexIndices = (int *)0x0;
  this->p = (Point3f *)0x0;
  this->n = (Normal3f *)0x0;
  this->s = (Vector3f *)0x0;
  this->n = (Normal3f *)0x0;
  this->s = (Vector3f *)0x0;
  this->uv = (Point2f *)0x0;
  this->faceIndices = (int *)0x0;
  vb = 0;
  local_38 = s;
  if (va != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x1c,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [21])"(indices.size() % 3)",(char (*) [2])0x2d6d9dd,
               (char (*) [21])"(indices.size() % 3)",&va,(char (*) [2])0x2d6d9dd,&vb);
  }
  *(long *)(in_FS_OFFSET + -0x338) = *(long *)(in_FS_OFFSET + -0x338) + 1;
  *(long *)(in_FS_OFFSET + -0x328) = *(long *)(in_FS_OFFSET + -0x328) + 0x40;
  *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + (long)iVar13;
  piVar14 = BufferCache<int>::LookupOrAdd(intBufferCache,indices);
  this->vertexIndices = piVar14;
  pPVar6 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pPVar15 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start; pPVar15 != pPVar6; pPVar15 = pPVar15 + 1
      ) {
    fVar1 = (pPVar15->super_Tuple3<pbrt::Point3,_float>).y;
    fVar2 = (pPVar15->super_Tuple3<pbrt::Point3,_float>).x;
    fVar3 = (pPVar15->super_Tuple3<pbrt::Point3,_float>).z;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[0][1])),
                              ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[0][0]));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[1][1])),
                              ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[1][0]));
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[3][1])),
                              ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[3][0]));
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[2][1])),
                              ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[2][0]));
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[0][2]));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[1][2]));
    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[3][2]));
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[2][2]));
    fVar1 = auVar25._0_4_ + (renderFromObject->m).m[3][3];
    fVar2 = auVar23._0_4_ + (renderFromObject->m).m[0][3];
    fVar3 = auVar11._0_4_ + (renderFromObject->m).m[1][3];
    fVar10 = auVar26._0_4_ + (renderFromObject->m).m[2][3];
    bVar12 = fVar1 == 1.0;
    auVar23 = vinsertps_avx(ZEXT416((uint)bVar12 * (int)fVar2 + (uint)!bVar12 * (int)(fVar2 / fVar1)
                                   ),ZEXT416((uint)bVar12 * (int)fVar3 +
                                             (uint)!bVar12 * (int)(fVar3 / fVar1)),0x10);
    uVar5 = vmovlps_avx(auVar23);
    (pPVar15->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar5;
    (pPVar15->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
    (pPVar15->super_Tuple3<pbrt::Point3,_float>).z =
         (float)((uint)bVar12 * (int)fVar10 + (uint)!bVar12 * (int)(fVar10 / fVar1));
  }
  pPVar16 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd(point3BufferCache,p);
  this->p = pPVar16;
  this->reverseOrientation = reverseOrientation;
  bVar12 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar12;
  lVar7 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float> !=
      lVar7) {
    vb = this->nVertices;
    va = lVar7 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->
                           super_Tuple3<pbrt::Normal3,_float> >> 3;
    if (va != (long)vb) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x2d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [10])"uv.size()",(char (*) [10])"nVertices",&vb,
                 (char (*) [10])"uv.size()",&va);
    }
    pPVar17 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                        (point2BufferCache,
                         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    this->uv = pPVar17;
  }
  puVar18 = *(undefined8 **)
             &(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>;
  puVar8 = *(undefined8 **)
            &((n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>).z;
  if (puVar18 != puVar8) {
    vb = this->nVertices;
    va = ((long)puVar8 - (long)puVar18 >> 2) * -0x5555555555555555;
    if (va - (long)vb != 0) {
      args_1 = "n.size()";
      iVar13 = 0x31;
      goto LAB_002d8f4e;
    }
    do {
      fVar1 = *(float *)((long)puVar18 + 4);
      uVar5 = *(undefined8 *)(renderFromObject->mInv).m[1];
      uVar4 = *(undefined4 *)puVar18;
      auVar28._4_4_ = uVar4;
      auVar28._0_4_ = uVar4;
      auVar28._8_4_ = uVar4;
      auVar28._12_4_ = uVar4;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(renderFromObject->mInv).m[0];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(renderFromObject->mInv).m[2];
      auVar23._0_4_ = fVar1 * (float)uVar5;
      auVar23._4_4_ = fVar1 * (float)((ulong)uVar5 >> 0x20);
      auVar23._8_4_ = fVar1 * 0.0;
      auVar23._12_4_ = fVar1 * 0.0;
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->mInv).m[1][2])),auVar28,
                                ZEXT416((uint)(renderFromObject->mInv).m[0][2]));
      auVar23 = vfmadd231ps_fma(auVar23,auVar28,auVar25);
      uVar4 = *(undefined4 *)(puVar18 + 1);
      auVar26._4_4_ = uVar4;
      auVar26._0_4_ = uVar4;
      auVar26._8_4_ = uVar4;
      auVar26._12_4_ = uVar4;
      auVar11 = vfmadd231ss_fma(auVar11,auVar26,ZEXT416((uint)(renderFromObject->mInv).m[2][2]));
      auVar23 = vfmadd231ps_fma(auVar23,auVar26,auVar27);
      uVar5 = vmovlps_avx(auVar23);
      *puVar18 = uVar5;
      *(uint *)(puVar18 + 1) = auVar11._0_4_;
      if (reverseOrientation) {
        auVar24._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
        auVar24._8_4_ = auVar23._8_4_ ^ 0x80000000;
        auVar24._12_4_ = auVar23._12_4_ ^ 0x80000000;
        uVar5 = vmovlps_avx(auVar24);
        *puVar18 = uVar5;
        *(uint *)(puVar18 + 1) = auVar11._0_4_ ^ 0x80000000;
      }
      puVar18 = (undefined8 *)((long)puVar18 + 0xc);
    } while (puVar18 != puVar8);
    pNVar19 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        (normal3BufferCache,
                         (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    this->n = pNVar19;
  }
  pVVar20 = (local_38->
            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (local_38->
           super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pVVar20 != pVVar9) {
    vb = this->nVertices;
    va = ((long)pVVar9 - (long)pVVar20 >> 2) * -0x5555555555555555;
    if (va - (long)vb != 0) {
      args_1 = "s.size()";
      iVar13 = 0x3a;
LAB_002d8f4e:
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,iVar13,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [9])args_1,(char (*) [10])"nVertices",&vb,(char (*) [9])args_1,&va);
    }
    do {
      fVar1 = (pVVar20->super_Tuple3<pbrt::Vector3,_float>).y;
      fVar2 = (pVVar20->super_Tuple3<pbrt::Vector3,_float>).x;
      fVar3 = (pVVar20->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[0][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[0][0]));
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[1][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[1][0]));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->m).m[2][1])),
                                ZEXT416((uint)fVar2),ZEXT416((uint)(renderFromObject->m).m[2][0]));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[0][2]));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[1][2]));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[2][2]));
      auVar23 = vinsertps_avx(auVar23,auVar11,0x10);
      uVar5 = vmovlps_avx(auVar23);
      (pVVar20->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar5;
      (pVVar20->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
      (pVVar20->super_Tuple3<pbrt::Vector3,_float>).z = auVar25._0_4_;
      pVVar20 = pVVar20 + 1;
    } while (pVVar20 != pVVar9);
    pVVar21 = BufferCache<pbrt::Vector3<float>_>::LookupOrAdd(vector3BufferCache,local_38);
    this->s = pVVar21;
  }
  lVar7 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->
                super_Tuple3<pbrt::Normal3,_float> != lVar7) {
    vb = this->nTriangles;
    va = lVar7 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super_Tuple3<pbrt::Normal3,_float> >> 2;
    if (va != (long)vb) {
      LogFatal<char_const(&)[11],char_const(&)[19],char_const(&)[11],int&,char_const(&)[19],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x41,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"nTriangles",
                 (char (*) [19])"faceIndices.size()",(char (*) [11])"nTriangles",&vb,
                 (char (*) [19])"faceIndices.size()",&va);
    }
    piVar14 = BufferCache<int>::LookupOrAdd
                        (intBufferCache,
                         (vector<int,_std::allocator<int>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this->faceIndices = piVar14;
  }
  vb = 0x7fffffff;
  va = ((long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if ((va & 0xffffffff80000000) == 0) {
    vb = 0x7fffffff;
    va = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2;
    if ((va & 0xffffffff80000000) == 0) {
      return;
    }
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x4b,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [15])"indices.size()",
               (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [15])"indices.size()",&va,
               (char (*) [32])"std::numeric_limits<int>::max()",&vb);
  }
  LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
             ,0x47,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [9])"p.size()",
             (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [9])"p.size()",&va,
             (char (*) [32])"std::numeric_limits<int>::max()",&vb);
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices);

    // Transform mesh vertices to render space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}